

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O3

kvtree * kvtree_extract(kvtree *hash,char *key)

{
  kvtree_elem_struct *pkVar1;
  kvtree_elem_struct **ppkVar2;
  kvtree_struct *pkVar3;
  kvtree_elem *pkVar4;
  kvtree_elem *unaff_RBX;
  
  if ((hash != (kvtree *)0x0) && (pkVar4 = kvtree_elem_get(hash,key), pkVar4 != (kvtree_elem *)0x0))
  {
    pkVar1 = (pkVar4->pointers).le_next;
    ppkVar2 = (pkVar4->pointers).le_prev;
    if (pkVar1 != (kvtree_elem_struct *)0x0) {
      (pkVar1->pointers).le_prev = ppkVar2;
    }
    *ppkVar2 = pkVar1;
    pkVar3 = pkVar4->hash;
    pkVar4->hash = (kvtree_struct *)0x0;
    kvtree_elem_delete(unaff_RBX);
    return pkVar3;
  }
  return (kvtree *)0x0;
}

Assistant:

kvtree* kvtree_extract(kvtree* hash, const char* key)
{
  if (hash == NULL) {
    return NULL;
  }

  kvtree_elem* elem = kvtree_elem_extract(hash, key);
  if (elem != NULL) {
    kvtree* elem_hash = elem->hash;
    elem->hash = NULL;
    kvtree_elem_delete(elem);
    return elem_hash;
  }
  return NULL;
}